

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

int yylex_SKIP_TO_ENDR(void)

{
  LexerState *pLVar1;
  bool bVar2;
  int iVar3;
  byte bVar4;
  int iVar5;
  
  pLVar1 = lexerState;
  lexerState->mode = LEXER_NORMAL;
  bVar4 = pLVar1->atLineStart;
  pLVar1->disableMacroArgs = true;
  pLVar1->disableInterpolation = true;
  iVar5 = 1;
  do {
    if ((bVar4 & 1) != 0) {
      while ((iVar3 = peek(), iVar3 == 0x20 || (iVar3 == 9))) {
        shiftChar();
      }
      bVar2 = startsIdentifier(iVar3);
      if (bVar2) {
        shiftChar();
        iVar3 = readIdentifier((char)iVar3);
        if (iVar3 - 0x73U < 2) {
          iVar5 = iVar5 + 1;
        }
        else if (iVar3 == 0x5d) {
          lexer_IncIFDepth();
        }
        else if (iVar3 == 0x60) {
          lexer_DecIFDepth();
        }
        else if ((iVar3 == 0x7b) && (iVar5 = iVar5 + -1, iVar5 == 0)) {
LAB_0010cec2:
          pLVar1 = lexerState;
          pLVar1->disableMacroArgs = false;
          pLVar1->disableInterpolation = false;
          pLVar1->atLineStart = false;
          return 0;
        }
      }
      bVar4 = 0;
    }
    do {
      iVar3 = nextChar();
      if ((iVar3 == 10) || (iVar3 == 0xd)) {
        bVar4 = 1;
      }
      else if (iVar3 == 0x5c) {
        iVar3 = nextChar();
      }
      else if (iVar3 == -1) goto LAB_0010cec2;
      if ((iVar3 == 0xd) || (iVar3 == 10)) {
        handleCRLF(iVar3);
        pLVar1 = lexerState;
        lexerState->lineNo = lexerState->lineNo + 1;
        pLVar1->colNo = 1;
      }
    } while ((bVar4 & 1) == 0);
  } while( true );
}

Assistant:

void lexer_SetMode(enum LexerMode mode)
{
	lexerState->mode = mode;
}